

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaJf.c
# Opt level: O0

void Jf_ObjPropagateBuf(Jf_Man_t *p,Gia_Obj_t *pObj,int fReverse)

{
  int ObjId;
  int iFanin;
  int iObj;
  int fReverse_local;
  Gia_Obj_t *pObj_local;
  Jf_Man_t *p_local;
  
  ObjId = Gia_ObjId(p->pGia,pObj);
  Gia_ObjFaninId0(pObj,ObjId);
  __assert_fail("0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaJf.c"
                ,0x456,"void Jf_ObjPropagateBuf(Jf_Man_t *, Gia_Obj_t *, int)");
}

Assistant:

static inline void Jf_ObjPropagateBuf( Jf_Man_t * p, Gia_Obj_t * pObj, int fReverse )
{
    int iObj = Gia_ObjId( p->pGia, pObj );
    int iFanin = Gia_ObjFaninId0( pObj, iObj );
    assert( 0 );
    assert( Gia_ObjIsBuf(pObj) );
    if ( fReverse )
        ABC_SWAP( int, iObj, iFanin );
    Vec_IntWriteEntry( &p->vArr,  iObj, Jf_ObjArr(p, iFanin) );
    Vec_FltWriteEntry( &p->vFlow, iObj, Jf_ObjFlow(p, iFanin) );
}